

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  sysbvm_contextCreationOptions_t contextOptions;
  sysbvm_contextCreationOptions_t local_e8;
  
  memset(&local_e8,0,0xb8);
  if (2 < argc) {
    iVar1 = strcmp(argv[1],"-load-image");
    if (iVar1 == 0) {
      context = sysbvm_context_loadImageFromFileNamed(argv[2]);
      iVar1 = 3;
      goto LAB_00102ca3;
    }
  }
  if (1 < argc) {
    uVar2 = 1;
    do {
      __s1 = argv[uVar2];
      iVar1 = strcmp(__s1,"-m32");
      if (iVar1 == 0) {
        local_e8.targetWordSize = 4;
      }
      else {
        iVar1 = strcmp(__s1,"-m64");
        if (iVar1 == 0) {
          local_e8.targetWordSize = 8;
        }
        else {
          iVar1 = strcmp(__s1,"-nojit");
          if (iVar1 == 0) {
            local_e8.nojit = true;
          }
          else {
            iVar1 = strcmp(__s1,"-nogc");
            if (iVar1 == 0) {
              local_e8.gcType = 3;
            }
            else {
              iVar1 = strcmp(__s1,"-moving-gc");
              if (iVar1 == 0) {
                local_e8.gcType = 1;
              }
              else {
                iVar1 = strcmp(__s1,"-non-moving-gc");
                if (iVar1 == 0) {
                  local_e8.gcType = 2;
                }
              }
            }
          }
        }
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  context = sysbvm_context_createWithOptions(&local_e8);
  iVar1 = 1;
LAB_00102ca3:
  if (context == (sysbvm_context_t *)0x0) {
    main_cold_1();
    iVar1 = 1;
  }
  else {
    iVar1 = mainWithContext(iVar1,argc,argv);
    if (destinationImageFilename != (char *)0x0) {
      sysbvm_context_saveImageToFileNamed(context,destinationImageFilename);
    }
    sysbvm_context_destroy(context);
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[])
{
    sysbvm_contextCreationOptions_t contextOptions = {0};

    // Allow creating the context by loading it from an image.
    int startArgumentIndex = 1;
    if(argc >= 3 && !strcmp(argv[1], "-load-image"))
    {
        context = sysbvm_context_loadImageFromFileNamed(argv[2]);
        startArgumentIndex = 3;
    }
    else
    {
        for(int i = 1; i < argc; ++i)
        {
            if(!strcmp(argv[i], "-m32"))
                contextOptions.targetWordSize = 4;
            else if(!strcmp(argv[i], "-m64"))
                contextOptions.targetWordSize = 8;
            else if(!strcmp(argv[i], "-nojit"))
                contextOptions.nojit = true;
            else if(!strcmp(argv[i], "-nogc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_DISABLED;
            else if(!strcmp(argv[i], "-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_MOVING;
            else if(!strcmp(argv[i], "-non-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_NON_MOVING;
        }

        context = sysbvm_context_createWithOptions(&contextOptions);
    }

    if(!context)
    {
        fprintf(stderr, "Failed to create sysbvm context.\n");
        return 1;
    }

    int exitCode = mainWithContext(startArgumentIndex, argc, argv);

    // Allow saving the context as an image.
    if(destinationImageFilename)
        sysbvm_context_saveImageToFileNamed(context, destinationImageFilename);
    sysbvm_context_destroy(context);
    
    return exitCode;
}